

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::Compaction::Compaction(Compaction *this,Options *options,int level)

{
  Compressor **ppCVar1;
  uint64_t uVar2;
  undefined4 in_EDX;
  Options *in_RDI;
  int i;
  undefined8 in_stack_ffffffffffffffc8;
  Compressor **local_20;
  int local_18;
  
  *(undefined4 *)&in_RDI->comparator = in_EDX;
  uVar2 = MaxFileSizeForLevel(in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  in_RDI->create_if_missing = (bool)(char)uVar2;
  in_RDI->error_if_exists = (bool)(char)(uVar2 >> 8);
  in_RDI->paranoid_checks = (bool)(char)(uVar2 >> 0x10);
  *(int5 *)&in_RDI->field_0xb = (int5)(uVar2 >> 0x18);
  in_RDI->env = (Env *)0x0;
  VersionEdit::VersionEdit((VersionEdit *)in_RDI);
  local_20 = in_RDI->compressors + 0xe;
  ppCVar1 = in_RDI->compressors;
  do {
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)0x12d614
              );
    local_20 = local_20 + 3;
  } while (local_20 != ppCVar1 + 0x14);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)0x12d63c);
  in_RDI->compressors[0x17] = (Compressor *)0x0;
  *(undefined1 *)(in_RDI->compressors + 0x18) = 0;
  in_RDI->compressors[0x19] = (Compressor *)0x0;
  for (local_18 = 0; local_18 < 7; local_18 = local_18 + 1) {
    in_RDI->compressors[(long)local_18 + 0x1a] = (Compressor *)0x0;
  }
  return;
}

Assistant:

Compaction::Compaction(const Options* options, int level)
    : level_(level),
      max_output_file_size_(MaxFileSizeForLevel(options, level)),
      input_version_(nullptr),
      grandparent_index_(0),
      seen_key_(false),
      overlapped_bytes_(0) {
  for (int i = 0; i < config::kNumLevels; i++) {
    level_ptrs_[i] = 0;
  }
}